

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  char *__s;
  int iVar1;
  long lVar2;
  IMutableContext *pIVar3;
  undefined4 extraout_var;
  string name;
  undefined1 *local_48;
  char *local_40;
  undefined1 local_38 [16];
  
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"<unknown signal>","");
  lVar2 = 8;
  do {
    if (*(int *)((long)&__dso_handle + lVar2) == sig) {
      __s = *(char **)((long)&signalDefs + lVar2);
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_48,0,local_40,(ulong)__s);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x68);
  reset();
  pIVar3 = getCurrentMutableContext();
  iVar1 = (*(pIVar3->super_IContext)._vptr_IContext[2])(pIVar3);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
            ((long *)CONCAT44(extraout_var,iVar1),&local_48);
  raise(sig);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

static void handleSignal( int sig ) {
            std::string name = "<unknown signal>";
            for (std::size_t i = 0; i < sizeof(signalDefs) / sizeof(SignalDefs); ++i) {
                SignalDefs &def = signalDefs[i];
                if (sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise( sig );
        }